

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O0

void __thiscall
agg::rasterizer_cells_aa<agg::cell_aa>::render_hline
          (rasterizer_cells_aa<agg::cell_aa> *this,int ey,int x1,int y1,int x2,int y2)

{
  int iVar1;
  int x;
  uint uVar2;
  int iVar3;
  int local_58;
  int local_54;
  int rem;
  int mod;
  int lift;
  int incr;
  longlong dx;
  int first;
  int p;
  int delta;
  int fx2;
  int fx1;
  int ex2;
  int ex1;
  int y2_local;
  int x2_local;
  int y1_local;
  int x1_local;
  int ey_local;
  rasterizer_cells_aa<agg::cell_aa> *this_local;
  
  x = x2 >> 8;
  uVar2 = x1 & 0xff;
  if (y1 == y2) {
    set_curr_cell(this,x,ey);
  }
  else if (x1 >> 8 == x) {
    (this->m_curr_cell).cover = (y2 - y1) + (this->m_curr_cell).cover;
    (this->m_curr_cell).area = (uVar2 + (x2 & 0xffU)) * (y2 - y1) + (this->m_curr_cell).area;
  }
  else {
    dx._4_4_ = (0x100 - uVar2) * (y2 - y1);
    dx._0_4_ = 0x100;
    mod = 1;
    _lift = (long)x2 - (long)x1;
    if (_lift < 0) {
      dx._4_4_ = uVar2 * (y2 - y1);
      dx._0_4_ = 0;
      mod = -1;
      _lift = -_lift;
    }
    first = (int)((long)dx._4_4_ / _lift);
    local_54 = (int)((long)dx._4_4_ % _lift);
    iVar1 = (int)_lift;
    if (local_54 < 0) {
      first = first + -1;
      local_54 = local_54 + iVar1;
    }
    (this->m_curr_cell).cover = first + (this->m_curr_cell).cover;
    (this->m_curr_cell).area = (uVar2 + (int)dx) * first + (this->m_curr_cell).area;
    fx1 = mod + (x1 >> 8);
    set_curr_cell(this,fx1,ey);
    y2_local = first + y1;
    if (fx1 != x) {
      iVar3 = ((y2 - y2_local) + first) * 0x100;
      rem = (int)((long)iVar3 / _lift);
      local_58 = (int)((long)iVar3 % _lift);
      if (local_58 < 0) {
        rem = rem + -1;
        local_58 = local_58 + iVar1;
      }
      local_54 = local_54 - iVar1;
      while (fx1 != x) {
        first = rem;
        local_54 = local_58 + local_54;
        if (-1 < local_54) {
          local_54 = local_54 - iVar1;
          first = rem + 1;
        }
        (this->m_curr_cell).cover = first + (this->m_curr_cell).cover;
        (this->m_curr_cell).area = first * 0x100 + (this->m_curr_cell).area;
        y2_local = first + y2_local;
        fx1 = mod + fx1;
        set_curr_cell(this,fx1,ey);
      }
    }
    (this->m_curr_cell).cover = (y2 - y2_local) + (this->m_curr_cell).cover;
    (this->m_curr_cell).area =
         (((x2 & 0xffU) + 0x100) - (int)dx) * (y2 - y2_local) + (this->m_curr_cell).area;
  }
  return;
}

Assistant:

AGG_INLINE void rasterizer_cells_aa<Cell>::render_hline(int ey, 
                                                            int x1, int y1, 
                                                            int x2, int y2)
    {
        int ex1 = x1 >> poly_subpixel_shift;
        int ex2 = x2 >> poly_subpixel_shift;
        int fx1 = x1 & poly_subpixel_mask;
        int fx2 = x2 & poly_subpixel_mask;

        int delta, p, first;
        long long dx;
        int incr, lift, mod, rem;

        //trivial case. Happens often
        if(y1 == y2)
        {
            set_curr_cell(ex2, ey);
            return;
        }

        //everything is located in a single cell.  That is easy!
        if(ex1 == ex2)
        {
            delta = y2 - y1;
            m_curr_cell.cover += delta;
            m_curr_cell.area  += (fx1 + fx2) * delta;
            return;
        }

        //ok, we'll have to render a run of adjacent cells on the same
        //hline...
        p     = (poly_subpixel_scale - fx1) * (y2 - y1);
        first = poly_subpixel_scale;
        incr  = 1;

        dx = (long long)x2 - (long long)x1;

        if(dx < 0)
        {
            p     = fx1 * (y2 - y1);
            first = 0;
            incr  = -1;
            dx    = -dx;
        }

        delta = (int)(p / dx);
        mod   = (int)(p % dx);

        if(mod < 0)
        {
            delta--;
            mod += dx;
        }

        m_curr_cell.cover += delta;
        m_curr_cell.area  += (fx1 + first) * delta;

        ex1 += incr;
        set_curr_cell(ex1, ey);
        y1  += delta;

        if(ex1 != ex2)
        {
            p     = poly_subpixel_scale * (y2 - y1 + delta);
            lift  = (int)(p / dx);
            rem   = (int)(p % dx);

            if (rem < 0)
            {
                lift--;
                rem += dx;
            }

            mod -= dx;

            while (ex1 != ex2)
            {
                delta = lift;
                mod  += rem;
                if(mod >= 0)
                {
                    mod -= dx;
                    delta++;
                }

                m_curr_cell.cover += delta;
                m_curr_cell.area  += poly_subpixel_scale * delta;
                y1  += delta;
                ex1 += incr;
                set_curr_cell(ex1, ey);
            }
        }
        delta = y2 - y1;
        m_curr_cell.cover += delta;
        m_curr_cell.area  += (fx2 + poly_subpixel_scale - first) * delta;
    }